

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O0

pdu_cache_response * begin_cache_response(uint8_t version,uint16_t session_id)

{
  long lVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  pdu_cache_response *ppVar4;
  long in_FS_OFFSET;
  pdu_cache_response *cache_response;
  uint16_t session_id_local;
  uint8_t version_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (data == (char *)0x0) {
    data = (char *)lrtr_malloc(8);
  }
  else {
    data = (char *)lrtr_realloc(data,data_size + 8);
  }
  if (data != (char *)0x0) {
    ppVar4 = (pdu_cache_response *)(data + data_size);
    ppVar4->ver = version;
    ppVar4->type = '\x03';
    uVar2 = lrtr_convert_short(TO_HOST_HOST_BYTE_ORDER,session_id);
    ppVar4->session_id = uVar2;
    uVar3 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,8);
    ppVar4->len = uVar3;
    data_size = data_size + 8;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return ppVar4;
    }
    __stack_chk_fail();
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                ,0x78,"struct pdu_cache_response *begin_cache_response(uint8_t, uint16_t)");
}

Assistant:

static struct pdu_cache_response *begin_cache_response(uint8_t version, uint16_t session_id)
{
	if (!data)
		data = lrtr_malloc(sizeof(struct pdu_cache_response));
	else
		data = lrtr_realloc(data, data_size + sizeof(struct pdu_cache_response));

	assert(data);

	struct pdu_cache_response *cache_response = (struct pdu_cache_response *)(data + data_size);

	cache_response->ver = version;
	cache_response->type = CACHE_RESPONSE;
	cache_response->session_id = BYTES16(session_id);
	cache_response->len = BYTES32(8);

	data_size += sizeof(struct pdu_cache_response);

	return cache_response;
}